

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::resolveReference(Value *this,char *key)

{
  const_iterator __position;
  bool bVar1;
  size_t sVar2;
  iterator this_00;
  reference ppVar3;
  Value *in_RSI;
  undefined8 *in_RDI;
  Value *value;
  value_type defaultValue;
  iterator it;
  CZString actualKey;
  ostringstream oss;
  Value *in_stack_fffffffffffffd58;
  pair<const_Json::Value::CZString,_Json::Value> *__x;
  __enable_if_t<is_constructible<value_type,_pair<const_CZString,_Value>_&>::value,_iterator>
  in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  ValueType in_stack_fffffffffffffd6c;
  ValueType VVar4;
  Value *in_stack_fffffffffffffd70;
  CZString *this_01;
  Value *in_stack_fffffffffffffd90;
  ostringstream *this_02;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_258;
  _Base_ptr local_250;
  undefined4 local_20c;
  _Self local_208;
  _Self local_200;
  CZString local_1f8 [3];
  string local_1c0 [48];
  ostringstream local_190 [376];
  Value *local_18;
  Value *local_8;
  
  if (((*(ushort *)(in_RDI + 1) & 0xff) != 0) && ((*(ushort *)(in_RDI + 1) & 0xff) != 7)) {
    this_02 = local_190;
    std::__cxx11::ostringstream::ostringstream(this_02);
    std::operator<<((ostream *)this_02,"in Json::Value::resolveReference(): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_1c0);
    abort();
  }
  local_18 = in_RSI;
  if ((*(ushort *)(in_RDI + 1) & 0xff) == 0) {
    Value(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    operator=((Value *)in_stack_fffffffffffffd60._M_node,in_stack_fffffffffffffd58);
    ~Value(in_stack_fffffffffffffd90);
  }
  sVar2 = strlen((char *)local_18);
  this_01 = local_1f8;
  CZString::CZString(this_01,(char *)local_18,(uint)sVar2,noDuplication);
  this_00 = std::
            map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::lower_bound((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_fffffffffffffd58,(key_type *)0x127ad8);
  local_200._M_node = this_00._M_node;
  local_208._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)in_stack_fffffffffffffd58);
  bVar1 = std::operator!=(&local_200,&local_208);
  VVar4 = in_stack_fffffffffffffd6c & 0xffffff;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x127b32);
    bVar1 = CZString::operator==(this_01,(CZString *)local_18);
    VVar4 = CONCAT13(bVar1,(int3)VVar4);
  }
  if ((char)(VVar4 >> 0x18) == '\0') {
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)this_00._M_node,this_01,local_18);
    __x = (pair<const_Json::Value::CZString,_Json::Value> *)*in_RDI;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_258,&local_200);
    __position._M_node._4_4_ = VVar4;
    __position._M_node._0_4_ = in_stack_fffffffffffffd68;
    in_stack_fffffffffffffd60 =
         std::
         map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
         ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                   (in_stack_fffffffffffffd60._M_node,__position,__x);
    local_250 = in_stack_fffffffffffffd60._M_node;
    local_200._M_node = in_stack_fffffffffffffd60._M_node;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x127c09);
    local_8 = &ppVar3->second;
    local_20c = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair
              ((pair<const_Json::Value::CZString,_Json::Value> *)in_stack_fffffffffffffd60._M_node);
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x127b5d);
    local_8 = &ppVar3->second;
    local_20c = 1;
  }
  CZString::~CZString((CZString *)in_stack_fffffffffffffd60._M_node);
  return local_8;
}

Assistant:

Value& Value::resolveReference(const char* key) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
  CZString actualKey(
      key, static_cast<unsigned>(strlen(key)), CZString::noDuplication); // NOTE!
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullRef);
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}